

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifft.cc
# Opt level: O3

int main(int argc,char **argv)

{
  int *piVar1;
  ulong uVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  size_t sVar6;
  ostream *poVar7;
  string *this;
  char *__s;
  int fft_length;
  InverseFastFourierTransform inverse_fast_fourier_transform;
  ostringstream error_message_5;
  vector<double,_std::allocator<double>_> imag;
  vector<double,_std::allocator<double>_> real;
  ifstream ifs;
  int local_448;
  uint local_444;
  string local_440;
  ulong local_420;
  InverseFastFourierTransform local_418;
  string local_3e0 [3];
  ios_base local_370 [264];
  vector<double,_std::allocator<double>_> local_268;
  vector<double,_std::allocator<double>_> local_250;
  string local_238;
  byte abStack_218 [80];
  ios_base local_1c8 [408];
  
  local_448 = 0x100;
  local_420 = 0;
  local_444 = 0;
LAB_0010371e:
  while (iVar5 = ya_getopt_long(argc,argv,"l:q:o:h",(option *)0x0,(int *)0x0), uVar2 = local_420,
        iVar5 == 0x6c) {
    std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
    bVar3 = sptk::ConvertStringToInteger(&local_238,&local_448);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238._M_dataplus._M_p != &local_238.field_2) {
      operator_delete(local_238._M_dataplus._M_p);
    }
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -l option must be an integer",0x31);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"ifft","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
LAB_00103acc:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3e0[0]._M_dataplus._M_p != &local_3e0[0].field_2) {
        operator_delete(local_3e0[0]._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_238);
      std::ios_base::~ios_base(local_1c8);
      return 1;
    }
  }
  if (iVar5 < 0x6f) {
    if (iVar5 == -1) {
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_238,"Too many input files",0x14);
        local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"ifft","");
        sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
        goto LAB_00103acc;
      }
      if (argc == ya_optind) {
        __s = (char *)0x0;
      }
      else {
        __s = argv[ya_optind];
      }
      bVar3 = sptk::SetBinaryMode();
      this = &local_238;
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)this);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this,"Cannot set translation mode",0x1b);
        local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"ifft","");
        sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
        goto LAB_00103acc;
      }
      std::ifstream::ifstream(this);
      if ((__s != (char *)0x0) &&
         (std::ifstream::open((char *)&local_238,(_Ios_Openmode)__s),
         (abStack_218[*(long *)(local_238._M_dataplus._M_p + -0x18)] & 5) != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_3e0,"Cannot open file ",0x11);
        sVar6 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_3e0,__s,sVar6);
        piVar1 = &local_418.fast_fourier_transform_.num_order_;
        local_418._vptr_InverseFastFourierTransform = (_func_int **)piVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"ifft","");
        sptk::PrintErrorMessage((string *)&local_418,(ostringstream *)local_3e0);
        if (local_418._vptr_InverseFastFourierTransform != (_func_int **)piVar1) {
          operator_delete(local_418._vptr_InverseFastFourierTransform);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
        std::ios_base::~ios_base(local_370);
        iVar5 = 1;
        goto LAB_00103fd6;
      }
      cVar4 = std::__basic_file<char>::is_open();
      if (cVar4 == '\0') {
        this = (string *)&std::cin;
      }
      sptk::InverseFastFourierTransform::InverseFastFourierTransform(&local_418,local_448);
      if (local_418.fast_fourier_transform_.is_valid_ != false) {
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_250,(long)local_448,(allocator_type *)local_3e0);
        std::vector<double,_std::allocator<double>_>::vector
                  (&local_268,(long)local_448,(allocator_type *)local_3e0);
        goto LAB_00103b90;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3e0,"FFT length must be a power of 2",0x1f);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ifft","");
      sptk::PrintErrorMessage(&local_440,(ostringstream *)local_3e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_440._M_dataplus._M_p != &local_440.field_2) {
        operator_delete(local_440._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
      std::ios_base::~ios_base(local_370);
      iVar5 = 1;
      goto LAB_00103faf;
    }
    if (iVar5 == 0x68) {
      anon_unknown.dwarf_2bca::PrintUsage((ostream *)&std::cout);
      return 0;
    }
  }
  else {
    if (iVar5 == 0x6f) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,(int *)&local_418);
      if (bVar3) {
        bVar3 = sptk::IsInRange((uint)local_418._vptr_InverseFastFourierTransform,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3) {
          local_420 = (ulong)local_418._vptr_InverseFastFourierTransform & 0xffffffff;
          goto LAB_0010371e;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -o option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
      std::ostream::operator<<((ostream *)poVar7,2);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"ifft","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_00103acc;
    }
    if (iVar5 == 0x71) {
      std::__cxx11::string::string((string *)&local_238,ya_optarg,(allocator *)local_3e0);
      bVar3 = sptk::ConvertStringToInteger(&local_238,(int *)&local_418);
      if (bVar3) {
        bVar3 = sptk::IsInRange((uint)local_418._vptr_InverseFastFourierTransform,0,2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p);
        }
        if (bVar3) {
          local_444 = (uint)local_418._vptr_InverseFastFourierTransform;
          goto LAB_0010371e;
        }
      }
      else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p);
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"The argument for the -q option must be an integer ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_238,"in the range of ",0x10);
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&local_238,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," to ",4);
      std::ostream::operator<<((ostream *)poVar7,2);
      local_3e0[0]._M_dataplus._M_p = (pointer)&local_3e0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_3e0,"ifft","");
      sptk::PrintErrorMessage(local_3e0,(ostringstream *)&local_238);
      goto LAB_00103acc;
    }
  }
  anon_unknown.dwarf_2bca::PrintUsage((ostream *)&std::cerr);
  return 1;
  while( true ) {
    bVar3 = sptk::InverseFastFourierTransform::Run(&local_418,&local_250,&local_268);
    if (!bVar3) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3e0,"Failed to run inverse fast Fourier transform",0x2c);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ifft","");
      sptk::PrintErrorMessage(&local_440,(ostringstream *)local_3e0);
      goto LAB_00103f59;
    }
    if (((uint)uVar2 < 2) &&
       (bVar3 = sptk::WriteStream<double>(0,local_448,&local_250,(ostream *)&std::cout,(int *)0x0),
       !bVar3)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_3e0,"Failed to write real parts",0x1a);
      local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ifft","");
      sptk::PrintErrorMessage(&local_440,(ostringstream *)local_3e0);
      goto LAB_00103f59;
    }
    if (((uVar2 & 0xfffffffd) == 0) &&
       (bVar3 = sptk::WriteStream<double>(0,local_448,&local_268,(ostream *)&std::cout,(int *)0x0),
       !bVar3)) break;
LAB_00103b90:
    if (((local_444 < 2) &&
        (bVar3 = sptk::ReadStream<double>(false,0,0,local_448,&local_250,(istream *)this,(int *)0x0)
        , !bVar3)) ||
       (((local_444 & 0xfffffffd) == 0 &&
        (bVar3 = sptk::ReadStream<double>(false,0,0,local_448,&local_268,(istream *)this,(int *)0x0)
        , !bVar3)))) {
      iVar5 = 0;
      goto LAB_00103f8b;
    }
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3e0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_3e0,"Failed to write imaginary parts",0x1f);
  local_440._M_dataplus._M_p = (pointer)&local_440.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,"ifft","");
  sptk::PrintErrorMessage(&local_440,(ostringstream *)local_3e0);
LAB_00103f59:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440._M_dataplus._M_p != &local_440.field_2) {
    operator_delete(local_440._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3e0);
  std::ios_base::~ios_base(local_370);
  iVar5 = 1;
LAB_00103f8b:
  if (local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_250.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00103faf:
  local_418._vptr_InverseFastFourierTransform =
       (_func_int **)&PTR__InverseFastFourierTransform_00110c98;
  local_418.fast_fourier_transform_._vptr_FastFourierTransform =
       (_func_int **)&PTR__FastFourierTransform_00110cc8;
  if (local_418.fast_fourier_transform_.sine_table_.
      super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(local_418.fast_fourier_transform_.sine_table_.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
LAB_00103fd6:
  std::ifstream::~ifstream(&local_238);
  return iVar5;
}

Assistant:

int main(int argc, char* argv[]) {
  int fft_length(kDefaultFftLength);
  InputFormats input_format(kDefaultInputFormat);
  OutputFormats output_format(kDefaultOutputFormat);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "l:q:o:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &fft_length)) {
          std::ostringstream error_message;
          error_message << "The argument for the -l option must be an integer";
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        break;
      }
      case 'q': {
        const int min(0);
        const int max(static_cast<int>(kNumInputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -q option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        input_format = static_cast<InputFormats>(tmp);
        break;
      }
      case 'o': {
        const int min(0);
        const int max(static_cast<int>(kNumOutputFormats) - 1);
        int tmp;
        if (!sptk::ConvertStringToInteger(optarg, &tmp) ||
            !sptk::IsInRange(tmp, min, max)) {
          std::ostringstream error_message;
          error_message << "The argument for the -o option must be an integer "
                        << "in the range of " << min << " to " << max;
          sptk::PrintErrorMessage("ifft", error_message);
          return 1;
        }
        output_format = static_cast<OutputFormats>(tmp);
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InverseFastFourierTransform inverse_fast_fourier_transform(fft_length);
  if (!inverse_fast_fourier_transform.IsValid()) {
    std::ostringstream error_message;
    error_message << "FFT length must be a power of 2";
    sptk::PrintErrorMessage("ifft", error_message);
    return 1;
  }

  std::vector<double> real(fft_length);
  std::vector<double> imag(fft_length);

  for (;;) {
    if ((kInputRealAndImagParts == input_format ||
         kInputRealPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &real, &input_stream,
                          NULL)) {
      break;
    }
    if ((kInputRealAndImagParts == input_format ||
         kInputImagPart == input_format) &&
        !sptk::ReadStream(false, 0, 0, fft_length, &imag, &input_stream,
                          NULL)) {
      break;
    }

    if (!inverse_fast_fourier_transform.Run(&real, &imag)) {
      std::ostringstream error_message;
      error_message << "Failed to run inverse fast Fourier transform";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputRealPart == output_format) &&
        !sptk::WriteStream(0, fft_length, real, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write real parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }

    if ((kOutputRealAndImagParts == output_format ||
         kOutputImagPart == output_format) &&
        !sptk::WriteStream(0, fft_length, imag, &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write imaginary parts";
      sptk::PrintErrorMessage("ifft", error_message);
      return 1;
    }
  }

  return 0;
}